

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

int32 __thiscall rw::Camera::frustumTestSphere(Camera *this,Sphere *s)

{
  V3d *a;
  int32 iVar1;
  int32 iVar2;
  long lVar3;
  float32 fVar4;
  float fVar5;
  
  lVar3 = 0;
  iVar2 = 2;
  while( true ) {
    if ((int)lVar3 == 0x78) {
      return iVar2;
    }
    a = (V3d *)((long)&this->frustumPlanes[0].plane.normal.x + lVar3);
    fVar4 = dot(a,&s->center);
    fVar5 = (float)fVar4 - (float)a[1].x;
    if ((float)s->radius < fVar5) break;
    iVar1 = 1;
    if ((float)s->radius <= -fVar5) {
      iVar1 = iVar2;
    }
    lVar3 = lVar3 + 0x14;
    iVar2 = iVar1;
  }
  return 0;
}

Assistant:

int32
Camera::frustumTestSphere(const Sphere *s) const
{
	int32 res = SPHEREINSIDE;
	const FrustumPlane *p = this->frustumPlanes;
	for(int32 i = 0; i < 6; i++){
		float32 dist = dot(p->plane.normal, s->center) - p->plane.distance;
		if(s->radius < dist)
			return SPHEREOUTSIDE;
		if(s->radius > -dist)
			res = SPHEREBOUNDARY;
		p++;
	}
	return res;
}